

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::noteDefaultDisable(Compilation *this,Scope *scope,Expression *expr)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ulong pos0;
  Diagnostic *this_00;
  ulong uVar8;
  ulong hash;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *ppVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *ppVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  undefined1 auVar18 [16];
  try_emplace_args_t local_71;
  flat_hash_map<const_Scope_*,_const_Expression_*> *local_70;
  Expression *local_68;
  Scope *local_60;
  ulong local_58;
  Expression *local_50;
  locator res;
  
  local_70 = &this->defaultDisableMap;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = scope;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->defaultDisableMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->defaultDisableMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar5 = (this->defaultDisableMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           .arrays.elements_;
  local_58 = (this->defaultDisableMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
             .arrays.groups_size_mask;
  uVar8 = 0;
  uVar12 = pos0;
  do {
    pgVar2 = pgVar4 + uVar12;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(pgVar2->m[0].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(pgVar2->m[1].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(pgVar2->m[2].n == uVar16);
    uVar17 = (uchar)((uint)uVar3 >> 0x18);
    auVar18[3] = -(pgVar2->m[3].n == uVar17);
    auVar18[4] = -(pgVar2->m[4].n == uVar14);
    auVar18[5] = -(pgVar2->m[5].n == uVar15);
    auVar18[6] = -(pgVar2->m[6].n == uVar16);
    auVar18[7] = -(pgVar2->m[7].n == uVar17);
    auVar18[8] = -(pgVar2->m[8].n == uVar14);
    auVar18[9] = -(pgVar2->m[9].n == uVar15);
    auVar18[10] = -(pgVar2->m[10].n == uVar16);
    auVar18[0xb] = -(pgVar2->m[0xb].n == uVar17);
    auVar18[0xc] = -(pgVar2->m[0xc].n == uVar14);
    auVar18[0xd] = -(pgVar2->m[0xd].n == uVar15);
    auVar18[0xe] = -(pgVar2->m[0xe].n == uVar16);
    auVar18[0xf] = -(pgVar2->m[0xf].n == uVar17);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
        uVar10 = uVar10 - 1 & uVar10) {
      iVar6 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (*(Scope **)((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4)) == scope) {
        ppVar9 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *)
                 ((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4));
        goto LAB_00144e41;
      }
    }
    if ((pgVar4[uVar12].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar11 = uVar12 + uVar8;
    uVar8 = uVar8 + 1;
    uVar12 = lVar11 + 1U & local_58;
  } while (uVar8 <= local_58);
  ppVar9 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *)0x0;
LAB_00144e41:
  ppVar13 = ppVar9;
  local_68 = expr;
  local_60 = scope;
  local_50 = expr;
  if (ppVar9 == (pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *)0x0) {
    if ((this->defaultDisableMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
        .size_ctrl.size <
        (this->defaultDisableMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Expression_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
                       *)local_70,(arrays_type *)local_70,pos0,hash,&local_71,&local_60,&local_68);
      psVar1 = &(this->defaultDisableMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar13 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Expression_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
                       *)local_70,hash,&local_71,&local_60,&local_68);
      ppVar13 = res.p;
    }
  }
  if (ppVar9 != (pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *)0x0) {
    this_00 = Scope::addDiag(scope,(DiagCode)0x16000d,local_50->sourceRange);
    Diagnostic::addNote(this_00,(DiagCode)0xa0001,ppVar13->second->sourceRange);
  }
  return;
}

Assistant:

void Compilation::noteDefaultDisable(const Scope& scope, const Expression& expr) {
    SLANG_ASSERT(!isFrozen());

    auto [it, inserted] = defaultDisableMap.emplace(&scope, &expr);
    if (!inserted) {
        auto& diag = scope.addDiag(diag::MultipleDefaultDisable, expr.sourceRange);
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
    }
}